

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O1

void __thiscall
cbtAlignedObjectArray<cbtPersistentManifold_*>::
quickSortInternal<cbtPersistentManifoldSortPredicateDeterministic>
          (cbtAlignedObjectArray<cbtPersistentManifold_*> *this,
          cbtPersistentManifoldSortPredicateDeterministic *CompareFunc,int lo,int hi)

{
  cbtPersistentManifold *pcVar1;
  cbtCollisionObject *pcVar2;
  cbtPersistentManifold *pcVar3;
  cbtCollisionObject *pcVar4;
  cbtPersistentManifold *pcVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  cbtPersistentManifold **ppcVar9;
  cbtCollisionObject *rcolObj0;
  int iVar10;
  cbtPersistentManifold *temp;
  cbtCollisionObject *rcolObj0_1;
  int iVar11;
  cbtCollisionObject *rcolObj0_5;
  int iVar12;
  
LAB_008dbde1:
  pcVar1 = this->m_data[(hi + lo) / 2];
  uVar7 = (ulong)(uint)hi;
  iVar8 = lo;
LAB_008dbdfe:
  pcVar2 = pcVar1->m_body0;
  iVar6 = pcVar2->m_islandTag1;
  ppcVar9 = this->m_data + iVar8;
  do {
    pcVar3 = *ppcVar9;
    pcVar4 = pcVar3->m_body0;
    iVar11 = pcVar4->m_islandTag1;
    iVar10 = iVar11;
    if (iVar11 < 0) {
      iVar10 = pcVar3->m_body1->m_islandTag1;
    }
    iVar12 = iVar6;
    if (iVar6 < 0) {
      iVar12 = pcVar1->m_body1->m_islandTag1;
    }
    if (iVar12 <= iVar10) {
      iVar10 = iVar11;
      if (iVar11 < 0) {
        iVar10 = pcVar3->m_body1->m_islandTag1;
      }
      iVar12 = iVar6;
      if (iVar6 < 0) {
        iVar12 = pcVar1->m_body1->m_islandTag1;
      }
      if ((iVar10 != iVar12) ||
         (pcVar2->m_broadphaseHandle->m_uniqueId <= pcVar4->m_broadphaseHandle->m_uniqueId)) {
        if (iVar11 < 0) {
          iVar11 = pcVar3->m_body1->m_islandTag1;
        }
        iVar10 = iVar6;
        if (iVar6 < 0) {
          iVar10 = pcVar1->m_body1->m_islandTag1;
        }
        if (((iVar11 != iVar10) ||
            (pcVar4->m_broadphaseHandle->m_uniqueId != pcVar2->m_broadphaseHandle->m_uniqueId)) ||
           (pcVar1->m_body1->m_broadphaseHandle->m_uniqueId <=
            pcVar3->m_body1->m_broadphaseHandle->m_uniqueId)) break;
      }
    }
    ppcVar9 = ppcVar9 + 1;
    iVar8 = iVar8 + 1;
  } while( true );
  uVar7 = (ulong)(int)uVar7;
  do {
    pcVar5 = this->m_data[uVar7];
    iVar11 = iVar6;
    if (iVar6 < 0) {
      iVar11 = pcVar1->m_body1->m_islandTag1;
    }
    pcVar4 = pcVar5->m_body0;
    iVar10 = pcVar4->m_islandTag1;
    iVar12 = iVar10;
    if (iVar10 < 0) {
      iVar12 = pcVar5->m_body1->m_islandTag1;
    }
    if (iVar12 <= iVar11) {
      iVar11 = iVar6;
      if (iVar6 < 0) {
        iVar11 = pcVar1->m_body1->m_islandTag1;
      }
      iVar12 = iVar10;
      if (iVar10 < 0) {
        iVar12 = pcVar5->m_body1->m_islandTag1;
      }
      if ((iVar11 != iVar12) ||
         (pcVar4->m_broadphaseHandle->m_uniqueId <= pcVar2->m_broadphaseHandle->m_uniqueId)) {
        iVar11 = iVar6;
        if (iVar6 < 0) {
          iVar11 = pcVar1->m_body1->m_islandTag1;
        }
        if (iVar10 < 0) {
          iVar10 = pcVar5->m_body1->m_islandTag1;
        }
        if (((iVar11 != iVar10) ||
            (pcVar2->m_broadphaseHandle->m_uniqueId != pcVar4->m_broadphaseHandle->m_uniqueId)) ||
           (pcVar5->m_body1->m_broadphaseHandle->m_uniqueId <=
            pcVar1->m_body1->m_broadphaseHandle->m_uniqueId)) break;
      }
    }
    uVar7 = uVar7 - 1;
  } while( true );
  if (iVar8 <= (int)uVar7) {
    *ppcVar9 = pcVar5;
    this->m_data[uVar7] = pcVar3;
    iVar8 = iVar8 + 1;
    uVar7 = (ulong)((int)uVar7 - 1);
  }
  iVar6 = (int)uVar7;
  if (iVar6 < iVar8) goto code_r0x008dc03e;
  goto LAB_008dbdfe;
code_r0x008dc03e:
  if (lo < iVar6) {
    quickSortInternal<cbtPersistentManifoldSortPredicateDeterministic>(this,CompareFunc,lo,iVar6);
  }
  lo = iVar8;
  if (hi <= iVar8) {
    return;
  }
  goto LAB_008dbde1;
}

Assistant:

void quickSortInternal(const L& CompareFunc, int lo, int hi)
	{
		//  lo is the lower index, hi is the upper index
		//  of the region of array a that is to be sorted
		int i = lo, j = hi;
		T x = m_data[(lo + hi) / 2];

		//  partition
		do
		{
			while (CompareFunc(m_data[i], x))
				i++;
			while (CompareFunc(x, m_data[j]))
				j--;
			if (i <= j)
			{
				swap(i, j);
				i++;
				j--;
			}
		} while (i <= j);

		//  recursion
		if (lo < j)
			quickSortInternal(CompareFunc, lo, j);
		if (i < hi)
			quickSortInternal(CompareFunc, i, hi);
	}